

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::LowerProfiledStElemI(Lowerer *this,JitProfilingInstr *instr,PropertyOperationFlags flags)

{
  LowererMD *pLVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  byte bVar6;
  uint uVar7;
  undefined4 *puVar8;
  IntConstOpnd *pIVar9;
  AddrOpnd *pAVar10;
  Opnd *opndArg;
  IndirOpnd *this_00;
  RegOpnd *opndArg_00;
  HelperCallOpnd *this_01;
  JnHelperMethod fnHelper;
  
  if (instr == (JitProfilingInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x235a,"(instr)","instr");
    if (!bVar4) goto LAB_005cfffa;
    *puVar8 = 0;
  }
  pFVar2 = (instr->super_Instr).m_func;
  if (flags == PropertyOperation_None) {
    fnHelper = HelperProfiledStElem_DefaultFlags;
  }
  else {
    pLVar1 = &this->m_lowererMD;
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,pFVar2,false);
    LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pIVar9->super_Opnd);
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,pFVar2,false);
    LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pIVar9->super_Opnd);
    pIVar9 = IR::IntConstOpnd::New((long)(int)flags,TyInt32,pFVar2,true);
    LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pIVar9->super_Opnd);
    fnHelper = HelperProfiledStElem;
  }
  pLVar1 = &this->m_lowererMD;
  pIVar9 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,pFVar2);
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pIVar9->super_Opnd);
  pAVar10 = CreateFunctionBodyOpnd(this,pFVar2);
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pAVar10->super_Opnd);
  opndArg = IR::Instr::UnlinkSrc1(&instr->super_Instr);
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,opndArg);
  this_00 = (IndirOpnd *)IR::Instr::UnlinkDst(&instr->super_Instr);
  OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_005cfffa;
    *puVar8 = 0;
  }
  pAVar10 = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(this_00);
  if (pAVar10 == (AddrOpnd *)0x0) {
    uVar7 = this_00->m_offset;
    if ((int)uVar7 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x237b,
                         "(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()))"
                         ,
                         "indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset())"
                        );
      if (!bVar4) goto LAB_005cfffa;
      *puVar8 = 0;
      uVar7 = this_00->m_offset;
    }
    pAVar10 = IR::AddrOpnd::New((Var)((ulong)uVar7 | 0x1000000000000),AddrOpndKindDynamicVar,pFVar2,
                                false,(Var)0x0);
  }
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pAVar10->super_Opnd);
  opndArg_00 = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&opndArg_00->super_Opnd);
  IR::Opnd::Free((Opnd *)this_00,pFVar2);
  this_01 = IR::HelperCallOpnd::New(fnHelper,pFVar2);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_005cfffa;
    *puVar8 = 0;
  }
  pFVar2 = (instr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_005cfffa:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  bVar6 = (this_01->super_Opnd).field_0xb;
  if ((bVar6 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar2);
    bVar6 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar6 | 2;
  (instr->super_Instr).m_src1 = &this_01->super_Opnd;
  LowererMD::LowerCall(pLVar1,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledStElemI(IR::JitProfilingInstr *const instr, const Js::PropertyOperationFlags flags)
{
    Assert(instr);

    /*
        void ProfilingHelpers::ProfiledStElem(
            const Var base,
            const Var varIndex,
            const Var value,
            FunctionBody *const functionBody,
            const ProfileId profileId,
            const PropertyOperationFlags flags,
            bool didArrayAccessHelperCall,
            bool bailedOutOnArraySpecialization)
    */

    Func *const func = instr->m_func;

    IR::JnHelperMethod helper;
    if(flags == Js::PropertyOperation_None)
    {
        helper = IR::HelperProfiledStElem_DefaultFlags;
    }
    else
    {
        helper = IR::HelperProfiledStElem;
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(flags, TyInt32, func, true));
    }
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(func));
    m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc1());
    IR::IndirOpnd *const indir = instr->UnlinkDst()->AsIndirOpnd();
    IR::Opnd *const indexOpnd = indir->UnlinkIndexOpnd();
    Assert(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()));
    m_lowererMD.LoadHelperArgument(
        instr,
        indexOpnd
            ? static_cast<IR::Opnd *>(indexOpnd)
            : IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(indir->GetOffset()), IR::AddrOpndKindDynamicVar, func));
    m_lowererMD.LoadHelperArgument(instr, indir->UnlinkBaseOpnd());
    indir->Free(func);

    instr->SetSrc1(IR::HelperCallOpnd::New(helper, func));
    m_lowererMD.LowerCall(instr, 0);
}